

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O1

void __thiscall json11::Json::Json(Json *this,char *value)

{
  undefined1 local_31;
  JsonString *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  char *local_20;
  
  local_30 = (JsonString *)0x0;
  local_20 = value;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<json11::JsonString,std::allocator<json11::JsonString>,char_const*&>
            (&local_28,&local_30,(allocator<json11::JsonString> *)&local_31,&local_20);
  (this->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_30;
  (this->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = local_28._M_pi;
  return;
}

Assistant:

Json::Json(const char * value)         : m_ptr(make_shared<JsonString>(value)) {}